

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O2

void test_interpolation_18(void)

{
  run("dotted names should be considered a form of shorthand for sections",
      "\"{{person.name}}\" == \"{{#person}}{{name}}{{/person}}\"",
      "{\"person\": {\"name\": \"Joe\"}}",(char *)0x0,"\"Joe\" == \"Joe\"");
  return;
}

Assistant:

static void
test_interpolation_18(void)
{
    run(
        "dotted names should be considered a form of shorthand for sections",
        "\"{{person.name}}\" == \"{{#person}}{{name}}{{/person}}\"",
        "{\"person\": {\"name\": \"Joe\"}}",
        NULL,
        "\"Joe\" == \"Joe\""
    );
}